

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcodeparse.y
# Opt level: O0

void __thiscall PcodeSnippet::~PcodeSnippet(PcodeSnippet *this)

{
  ConstructTpl *this_00;
  bool bVar1;
  reference ppSVar2;
  _Self local_28;
  _Base_ptr local_20;
  _Rb_tree_const_iterator<SleighSymbol_*> local_18;
  iterator iter;
  PcodeSnippet *this_local;
  
  (this->super_PcodeCompile)._vptr_PcodeCompile = (_func_int **)&PTR_allocateTemp_0085a570;
  iter._M_node = (_Base_ptr)this;
  std::_Rb_tree_const_iterator<SleighSymbol_*>::_Rb_tree_const_iterator(&local_18);
  local_20 = (_Base_ptr)
             std::set<SleighSymbol_*,_SymbolCompare,_std::allocator<SleighSymbol_*>_>::begin
                       (&this->tree);
  local_18._M_node = local_20;
  while( true ) {
    local_28._M_node =
         (_Base_ptr)
         std::set<SleighSymbol_*,_SymbolCompare,_std::allocator<SleighSymbol_*>_>::end(&this->tree);
    bVar1 = std::operator!=(&local_18,&local_28);
    if (!bVar1) break;
    ppSVar2 = std::_Rb_tree_const_iterator<SleighSymbol_*>::operator*(&local_18);
    if (*ppSVar2 != (SleighSymbol *)0x0) {
      (*(*ppSVar2)->_vptr_SleighSymbol[1])();
    }
    std::_Rb_tree_const_iterator<SleighSymbol_*>::operator++(&local_18);
  }
  if (this->result != (ConstructTpl *)0x0) {
    this_00 = this->result;
    if (this_00 != (ConstructTpl *)0x0) {
      ConstructTpl::~ConstructTpl(this_00);
      operator_delete(this_00);
    }
    this->result = (ConstructTpl *)0x0;
  }
  std::__cxx11::string::~string((string *)&this->firsterror);
  std::set<SleighSymbol_*,_SymbolCompare,_std::allocator<SleighSymbol_*>_>::~set(&this->tree);
  PcodeLexer::~PcodeLexer(&this->lexer);
  PcodeCompile::~PcodeCompile(&this->super_PcodeCompile);
  return;
}

Assistant:

PcodeSnippet::~PcodeSnippet(void)

{
  SymbolTree::iterator iter;
  for(iter=tree.begin();iter!=tree.end();++iter)
    delete *iter;		// Free ALL temporary symbols
  if (result != (ConstructTpl *)0) {
    delete result;
    result = (ConstructTpl *)0;
  }
}